

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
* __thiscall
wallet::CWallet::GetAllScriptPubKeyMans
          (set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
           *__return_storage_ptr__,CWallet *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  long in_FS_OFFSET;
  ScriptPubKeyMan *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_30 = *(ScriptPubKeyMan **)(p_Var1 + 2);
      std::
      _Rb_tree<wallet::ScriptPubKeyMan*,wallet::ScriptPubKeyMan*,std::_Identity<wallet::ScriptPubKeyMan*>,std::less<wallet::ScriptPubKeyMan*>,std::allocator<wallet::ScriptPubKeyMan*>>
      ::_M_insert_unique<wallet::ScriptPubKeyMan*>
                ((_Rb_tree<wallet::ScriptPubKeyMan*,wallet::ScriptPubKeyMan*,std::_Identity<wallet::ScriptPubKeyMan*>,std::less<wallet::ScriptPubKeyMan*>,std::allocator<wallet::ScriptPubKeyMan*>>
                  *)__return_storage_ptr__,&local_30);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::set<ScriptPubKeyMan*> CWallet::GetAllScriptPubKeyMans() const
{
    std::set<ScriptPubKeyMan*> spk_mans;
    for (const auto& spk_man_pair : m_spk_managers) {
        spk_mans.insert(spk_man_pair.second.get());
    }
    return spk_mans;
}